

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

bool __thiscall QPDFFormFieldObjectHelper::isRadioButton(QPDFFormFieldObjectHelper *this)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  string local_30;
  
  getFieldType_abi_cxx11_(&local_30,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  if (iVar1 == 0) {
    uVar2 = getFlags(this);
    bVar3 = SUB41((uVar2 & 0xffff) >> 0xf,0);
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isRadioButton()
{
    return ((getFieldType() == "/Btn") && ((getFlags() & ff_btn_radio) == ff_btn_radio));
}